

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

i64 sqlite3BtreeRowCountEst(BtCursor *pCur)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = 0xffffffffffffffff;
  if ((pCur->eState == '\0') && (pCur->pPage->leaf != '\0')) {
    uVar1 = (ulong)pCur->pPage->nCell;
    if (0 < (long)pCur->iPage) {
      lVar2 = 0;
      do {
        uVar1 = uVar1 * pCur->apPage[lVar2]->nCell;
        lVar2 = lVar2 + 1;
      } while (pCur->iPage != lVar2);
    }
  }
  return uVar1;
}

Assistant:

SQLITE_PRIVATE i64 sqlite3BtreeRowCountEst(BtCursor *pCur){
  i64 n;
  u8 i;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );

  /* Currently this interface is only called by the OP_IfSmaller
  ** opcode, and it that case the cursor will always be valid and
  ** will always point to a leaf node. */
  if( NEVER(pCur->eState!=CURSOR_VALID) ) return -1;
  if( NEVER(pCur->pPage->leaf==0) ) return -1;

  n = pCur->pPage->nCell;
  for(i=0; i<pCur->iPage; i++){
    n *= pCur->apPage[i]->nCell;
  }
  return n;
}